

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Lamp>
          (Structure *this,Lamp *dest,FileDatabase *db)

{
  uint in_EAX;
  int temp;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  uStack_28 = (ulong)(uint)uStack_28;
  ReadField<2,int>(this,(int *)((long)&uStack_28 + 4),"type",db);
  dest->type = uStack_28._4_4_;
  ReadField<1,short>(this,&dest->flags,"flag",db);
  ReadField<1,short>(this,&dest->colormodel,"colormodel",db);
  ReadField<1,short>(this,&dest->totex,"totex",db);
  ReadField<1,float>(this,&dest->r,"r",db);
  ReadField<1,float>(this,&dest->g,"g",db);
  ReadField<1,float>(this,&dest->b,"b",db);
  ReadField<1,float>(this,&dest->k,"k",db);
  ReadField<1,float>(this,&dest->energy,"energy",db);
  ReadField<1,float>(this,&dest->dist,"dist",db);
  ReadField<1,float>(this,&dest->spotsize,"spotsize",db);
  ReadField<1,float>(this,&dest->spotblend,"spotblend",db);
  ReadField<1,float>(this,&dest->constant_coefficient,"coeff_const",db);
  ReadField<1,float>(this,&dest->linear_coefficient,"coeff_lin",db);
  ReadField<1,float>(this,&dest->quadratic_coefficient,"coeff_quad",db);
  ReadField<1,float>(this,&dest->att1,"att1",db);
  ReadField<1,float>(this,&dest->att2,"att2",db);
  ReadField<1,int>(this,(int *)((long)&uStack_28 + 4),"falloff_type",db);
  dest->falloff_type = uStack_28._4_4_;
  ReadField<1,float>(this,&dest->sun_brightness,"sun_brightness",db);
  ReadField<1,float>(this,&dest->area_size,"area_size",db);
  ReadField<1,float>(this,&dest->area_sizey,"area_sizey",db);
  ReadField<1,float>(this,&dest->area_sizez,"area_sizez",db);
  ReadField<1,short>(this,&dest->area_shape,"area_shape",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Lamp> (
    Lamp& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Lamp::Type>(temp);
    ReadField<ErrorPolicy_Igno>(dest.flags,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.colormodel,"colormodel",db);
    ReadField<ErrorPolicy_Igno>(dest.totex,"totex",db);
    ReadField<ErrorPolicy_Warn>(dest.r,"r",db);
    ReadField<ErrorPolicy_Warn>(dest.g,"g",db);
    ReadField<ErrorPolicy_Warn>(dest.b,"b",db);
    ReadField<ErrorPolicy_Warn>(dest.k,"k",db);
    ReadField<ErrorPolicy_Igno>(dest.energy,"energy",db);
    ReadField<ErrorPolicy_Warn>(dest.dist,"dist",db);
    ReadField<ErrorPolicy_Igno>(dest.spotsize,"spotsize",db);
    ReadField<ErrorPolicy_Igno>(dest.spotblend,"spotblend",db);
    ReadField<ErrorPolicy_Warn>(dest.constant_coefficient, "coeff_const", db);
    ReadField<ErrorPolicy_Warn>(dest.linear_coefficient, "coeff_lin", db);
    ReadField<ErrorPolicy_Warn>(dest.quadratic_coefficient, "coeff_quad", db);
    ReadField<ErrorPolicy_Igno>(dest.att1,"att1",db);
    ReadField<ErrorPolicy_Igno>(dest.att2,"att2",db);
    ReadField<ErrorPolicy_Igno>(temp,"falloff_type",db);
    dest.falloff_type = static_cast<Assimp::Blender::Lamp::FalloffType>(temp);
    ReadField<ErrorPolicy_Igno>(dest.sun_brightness,"sun_brightness",db);
    ReadField<ErrorPolicy_Igno>(dest.area_size,"area_size",db);
    ReadField<ErrorPolicy_Igno>(dest.area_sizey,"area_sizey",db);
    ReadField<ErrorPolicy_Igno>(dest.area_sizez,"area_sizez",db);
    ReadField<ErrorPolicy_Igno>(dest.area_shape,"area_shape",db);

    db.reader->IncPtr(size);
}